

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void rand_pk(secp256k1_pubkey *pk)

{
  int iVar1;
  secp256k1_keypair keypair;
  uchar seckey [32];
  secp256k1_keypair *in_stack_ffffffffffffff78;
  secp256k1_pubkey *in_stack_ffffffffffffff80;
  secp256k1_context *in_stack_ffffffffffffff88;
  
  secp256k1_testrand256(in_stack_ffffffffffffff80->data);
  iVar1 = secp256k1_keypair_create
                    ((secp256k1_context *)keypair.data._24_8_,
                     (secp256k1_keypair *)keypair.data._16_8_,(uchar *)keypair.data._8_8_);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x294,"test condition failed: secp256k1_keypair_create(CTX, &keypair, seckey) == 1");
    abort();
  }
  iVar1 = secp256k1_keypair_pub
                    (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x295,"test condition failed: secp256k1_keypair_pub(CTX, pk, &keypair) == 1");
    abort();
  }
  return;
}

Assistant:

static void rand_pk(secp256k1_pubkey *pk) {
    unsigned char seckey[32];
    secp256k1_keypair keypair;
    secp256k1_testrand256(seckey);
    CHECK(secp256k1_keypair_create(CTX, &keypair, seckey) == 1);
    CHECK(secp256k1_keypair_pub(CTX, pk, &keypair) == 1);
}